

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

bool __thiscall
MADPComponentDiscreteObservations::SetInitialized(MADPComponentDiscreteObservations *this,bool b)

{
  value_type vVar1;
  byte bVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_t *psVar5;
  ulong uVar6;
  reference pvVar7;
  void *__s;
  byte in_SIL;
  char *in_RDI;
  Index i;
  size_t prevNrJO;
  size_t nrJO;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar8;
  ulong local_30;
  
  bVar2 = in_SIL & 1;
  if (bVar2 == 0) {
    if (((in_RDI[8] & 1U) == 1) && (*(void **)(in_RDI + 0x18) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x18));
    }
    in_RDI[8] = '\0';
  }
  else {
    if ((((in_RDI[8] & 1U) == 1) && (bVar2 == 1)) && (*(void **)(in_RDI + 0x18) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x18));
    }
    if (bVar2 == 1) {
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
      if (sVar3 == 0) {
        uVar4 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
        __cxa_throw(uVar4,&E::typeinfo,E::~E);
      }
      psVar5 = IndexTools::CalculateStepSize(in_stack_ffffffffffffff98);
      *(size_t **)(in_RDI + 0x18) = psVar5;
      if ((in_RDI[9] & 1U) == 0) {
        local_30 = 1;
        uVar8 = 0;
        while( true ) {
          uVar6 = (ulong)uVar8;
          sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (in_RDI + 0x40));
          if (uVar6 == sVar3) break;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x40),(ulong)uVar8);
          vVar1 = *pvVar7;
          if (vVar1 * local_30 < local_30) {
            in_RDI[10] = '\0';
          }
          uVar8 = uVar8 + 1;
          local_30 = vVar1 * local_30;
        }
        *(ulong *)(in_RDI + 0x10) = local_30;
        __s = operator_new(0x30);
        memset(__s,0,0x30);
        std::
        map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
        ::map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               *)0xad30ea);
        *(void **)(in_RDI + 0x38) = __s;
      }
      else {
        sVar3 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                ::size((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                        *)(in_RDI + 0x20));
        *(size_type *)(in_RDI + 0x10) = sVar3;
      }
      in_RDI[8] = '\x01';
    }
  }
  return true;
}

Assistant:

bool MADPComponentDiscreteObservations::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_observationStepSize;
        _m_initialized = b;
        return true;
    }
    if(_m_initialized == true && b == true)
    {
        //first free mem before re-initialize:
        delete [] _m_observationStepSize;
    }
    if(b == true)
    {
        if(_m_nrObservations.size() == 0)
            throw(E("MADPComponentDiscreteObservations::SetInitialized() no observations specified"));
        _m_observationStepSize=
            IndexTools::CalculateStepSize(_m_nrObservations);

        if(!_m_cachedAllJointObservations)
        {
            size_t nrJO=1;
            size_t prevNrJO=nrJO;
            for(Index i=0;i!=_m_nrObservations.size();++i)
            {
                nrJO*=_m_nrObservations[i];
                // detect overflow
                if(nrJO<prevNrJO)
                    _m_jointIndicesValid=false;
                prevNrJO=nrJO;
            }
            _m_nrJointObservations=nrJO;
            _m_jointObservationIndices=
                new map<Index, vector<Index> *>();
        }
        else
            _m_nrJointObservations=_m_jointObservationVec.size();
        _m_initialized = b;
    }    
    return(true);
}